

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

Am_Value __thiscall Am_Input_Char::operator_cast_to_Am_Value(Am_Input_Char *this)

{
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  short *in_RSI;
  Am_Value AVar1;
  long l;
  Am_Input_Char *this_local;
  
  Am_Value::Am_Value((Am_Value *)this,
                     ((((((ulong)((ushort)in_RSI[1] >> 8 & 0xf) << 4 |
                         (ulong)((ushort)in_RSI[1] >> 4 & 0xf)) << 1 |
                        (long)(int)(uint)((byte)((ushort)in_RSI[1] >> 3) & 1)) << 1 |
                       (long)(int)(uint)((byte)((ushort)in_RSI[1] >> 2) & 1)) << 1 |
                      (long)(int)(uint)((byte)((ushort)in_RSI[1] >> 1) & 1)) << 1 |
                     (long)(int)(uint)((byte)in_RSI[1] & 1)) << 0x10 | (long)*in_RSI,
                     Am_Input_Char_ID);
  AVar1.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

Am_Input_Char::operator Am_Value() const
{
  long l;
  l = click_count;
  l = (l << 4) | button_down;
  l = (l << 1) | (any_modifier & 1); // The Mac stores these values as full
  l = (l << 1) | (meta & 1);         // ints.  Pick out just the lowest bit.
  l = (l << 1) | (control & 1);
  l = (l << 1) | (shift & 1);
  l = (l << 16) | code;
  return Am_Value(l, Am_Input_Char_ID);
}